

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlDocPtr xmlParseCatalogFile(char *filename)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  xmlParserInputBufferPtr in;
  xmlParserInputPtr input;
  xmlChar *pxVar2;
  xmlDocPtr cur;
  
  ctxt = xmlNewParserCtxt();
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x14,
                        (xmlError *)0x0);
  }
  else {
    in = xmlParserInputBufferCreateFilename(filename,XML_CHAR_ENCODING_NONE);
    if (in != (xmlParserInputBufferPtr)0x0) {
      input = xmlNewInputStream(ctxt);
      if (input == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(in);
      }
      else {
        pxVar2 = xmlCanonicPath((xmlChar *)filename);
        input->filename = (char *)pxVar2;
        input->buf = in;
        xmlBufResetInput(in->buffer,input);
        iVar1 = xmlCtxtPushInput(ctxt,input);
        if (-1 < iVar1) {
          ctxt->valid = 0;
          ctxt->validate = 0;
          ctxt->loadsubset = 0;
          ctxt->pedantic = 0;
          ctxt->dictNames = 1;
          xmlParseDocument(ctxt);
          cur = ctxt->myDoc;
          if (ctxt->wellFormed == 0) {
            xmlFreeDoc(cur);
            ctxt->myDoc = (xmlDocPtr)0x0;
            cur = (xmlDocPtr)0x0;
          }
          xmlFreeParserCtxt(ctxt);
          return cur;
        }
        xmlFreeInputStream(input);
      }
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlParseCatalogFile(const char *filename) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    xmlParserInputBufferPtr buf;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }

    buf = xmlParserInputBufferCreateFilename(filename, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputStream = xmlNewInputStream(ctxt);
    if (inputStream == NULL) {
	xmlFreeParserInputBuffer(buf);
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    inputStream->filename = (char *) xmlCanonicPath((const xmlChar *)filename);
    inputStream->buf = buf;
    xmlBufResetInput(buf->buffer, inputStream);

    if (xmlCtxtPushInput(ctxt, inputStream) < 0) {
        xmlFreeInputStream(inputStream);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    ctxt->valid = 0;
    ctxt->validate = 0;
    ctxt->loadsubset = 0;
    ctxt->pedantic = 0;
    ctxt->dictNames = 1;

    xmlParseDocument(ctxt);

    if (ctxt->wellFormed)
	ret = ctxt->myDoc;
    else {
        ret = NULL;
        xmlFreeDoc(ctxt->myDoc);
        ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return(ret);
}